

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallSubdirectoryGenerator.cxx
# Opt level: O0

void __thiscall
cmInstallSubdirectoryGenerator::cmInstallSubdirectoryGenerator
          (cmInstallSubdirectoryGenerator *this,cmMakefile *makefile,char *binaryDirectory,
          bool excludeFromAll)

{
  char *__s;
  allocator<char> local_55 [13];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  byte local_21;
  char *pcStack_20;
  bool excludeFromAll_local;
  char *binaryDirectory_local;
  cmMakefile *makefile_local;
  cmInstallSubdirectoryGenerator *this_local;
  
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_21 = excludeFromAll;
  pcStack_20 = binaryDirectory;
  binaryDirectory_local = (char *)makefile;
  makefile_local = (cmMakefile *)this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_48);
  cmInstallGenerator::cmInstallGenerator
            (&this->super_cmInstallGenerator,(char *)0x0,&local_48,(char *)0x0,MessageDefault,
             (bool)(local_21 & 1));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  __s = pcStack_20;
  (this->super_cmInstallGenerator).super_cmScriptGenerator._vptr_cmScriptGenerator =
       (_func_int **)&PTR__cmInstallSubdirectoryGenerator_00af8978;
  this->Makefile = (cmMakefile *)binaryDirectory_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->BinaryDirectory,__s,local_55);
  std::allocator<char>::~allocator(local_55);
  return;
}

Assistant:

cmInstallSubdirectoryGenerator::cmInstallSubdirectoryGenerator(
  cmMakefile* makefile, const char* binaryDirectory, bool excludeFromAll)
  : cmInstallGenerator(nullptr, std::vector<std::string>(), nullptr,
                       MessageDefault, excludeFromAll)
  , Makefile(makefile)
  , BinaryDirectory(binaryDirectory)
{
}